

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

SingleCallCounter * __thiscall
JsUtil::
List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
RemoveAtEnd(SingleCallCounter *__return_storage_ptr__,
           List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  long lVar5;
  SingleCallCounter *pSVar6;
  byte bVar7;
  
  bVar7 = 0;
  if ((this->super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>).
      count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x1d2,"(this->count >= 1)","this->count >= 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pTVar4 = Item(this,(this->
                     super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
                     ).count + -1);
  pSVar6 = __return_storage_ptr__;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    pSVar6->Function = pTVar4->Function;
    pTVar4 = (Type *)((long)pTVar4 + (ulong)bVar7 * -0x10 + 8);
    pSVar6 = (SingleCallCounter *)((long)pSVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  Js::
  CopyRemovePolicy<JsUtil::List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::RemoveAt((CopyRemovePolicy<JsUtil::List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              *)&this->field_0x28,this,
             (this->
             super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>).
             count + -1);
  return __return_storage_ptr__;
}

Assistant:

T RemoveAtEnd()
        {
            Assert(this->count >= 1);
            T item = this->Item(this->count - 1);
            RemoveAt(this->count - 1);
            return item;
        }